

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::Brick_Mass::Evaluate
          (Brick_Mass *this,ChMatrixNM<double,_24,_24> *result,double x,double y,double z)

{
  ChMatrixNM<double,_3,_24> *a_rhs;
  double dVar1;
  double dVar2;
  double dVar3;
  ChElementHexaANCF_3813 *pCVar4;
  ChMatrixNM<double,_8,_3> *pCVar5;
  undefined8 uVar6;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  long lVar7;
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  double dVar35;
  undefined1 auVar36 [32];
  double dVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  Scalar local_12b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_0,_24,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_24,_1,_3,_24>_>_>
  local_12b0;
  ChMatrixNM<double,_3,_24> *local_1288;
  Matrix<double,_24,_24,_0,_24,_24> local_1280;
  
  dVar35 = x;
  ChElementHexaANCF_3813::ShapeFunctions((ChElementHexaANCF_3813 *)this,&this->N,x,y,z);
  dVar37 = y;
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeX(this->element,&this->Nx,dVar35,y,z);
  ChElementHexaANCF_3813::ShapeFunctionsDerivativeY(this->element,&this->Ny,x,dVar37,z);
  pCVar4 = this->element;
  auVar18._8_8_ = 0x3ff0000000000000;
  auVar18._0_8_ = 0x3ff0000000000000;
  a_rhs = &this->S;
  lVar7 = 0;
  auVar29 = vshufpd_avx(auVar18,auVar18,3);
  dVar35 = (2.0 / (pCVar4->m_InertFlexVec).m_data[2]) * 0.125;
  auVar30 = vpermpd_avx2(ZEXT1632(CONCAT88((x + 1.0) * dVar35,(1.0 - x) * dVar35)),0x14);
  auVar36._0_8_ = (1.0 - y) * auVar30._0_8_;
  auVar36._8_8_ = (1.0 - y) * auVar30._8_8_;
  auVar36._16_8_ = (y + auVar29._0_8_) * auVar30._16_8_;
  auVar36._24_8_ = (y + auVar29._8_8_) * auVar30._24_8_;
  auVar30._8_8_ = 0x8000000000000000;
  auVar30._0_8_ = 0x8000000000000000;
  auVar30._16_8_ = 0x8000000000000000;
  auVar30._24_8_ = 0x8000000000000000;
  auVar30 = vxorpd_avx512vl(auVar36,auVar30);
  *(undefined1 (*) [32])
   (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array =
       auVar30;
  *(undefined1 (*) [32])
   ((this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.array +
   4) = auVar36;
  auVar38 = ZEXT3264(_DAT_00998460);
  auVar31 = *(undefined1 (*) [64])
             (this->N).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data
             .array;
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x40) + auVar38 * (undefined1  [64])0x8,0xffff,auVar31
                     );
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x108) + auVar38 * (undefined1  [64])0x8,0xffff,
                      auVar31);
  vscatterdpd_avx512f(ZEXT864(this) + ZEXT864(0x1d0) + auVar38 * (undefined1  [64])0x8,0xffff,
                      auVar31);
  pCVar5 = this->d0;
  dVar35 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[0];
  auVar43._8_8_ = dVar35;
  auVar43._0_8_ = dVar35;
  dVar37 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
           array[1];
  auVar45._8_8_ = dVar37;
  auVar45._0_8_ = dVar37;
  dVar1 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
          array[2];
  auVar48._8_8_ = dVar1;
  auVar48._0_8_ = dVar1;
  dVar1 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
          array[3];
  auVar50._8_8_ = dVar1;
  auVar50._0_8_ = dVar1;
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar8 = vmovddup_avx512vl(auVar29);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar9 = vmovddup_avx512vl(auVar22);
  dVar2 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
          array[6];
  auVar41._8_8_ = dVar2;
  auVar41._0_8_ = dVar2;
  dVar2 = (this->Nx).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
          array[7];
  auVar39._8_8_ = dVar2;
  auVar39._0_8_ = dVar2;
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar10 = vmovddup_avx512vl(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar11 = vmovddup_avx512vl(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar12 = vmovddup_avx512vl(auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar13 = vmovddup_avx512vl(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar14 = vmovddup_avx512vl(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar15 = vmovddup_avx512vl(auVar28);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar16 = vmovddup_avx512vl(auVar19);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar17 = vmovddup_avx512vl(auVar17);
  auVar29 = *(undefined1 (*) [16])
             (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data
             .array;
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [2];
  auVar22 = *(undefined1 (*) [16])
             ((pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 3);
  auVar23 = *(undefined1 (*) [16])
             ((pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 6);
  auVar24 = *(undefined1 (*) [16])
             ((pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 9);
  auVar25 = *(undefined1 (*) [16])
             ((pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0xc);
  auVar26 = *(undefined1 (*) [16])
             ((pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0xf);
  dVar2 = (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
          array[0x11];
  auVar27 = *(undefined1 (*) [16])
             ((pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0x12);
  auVar28 = *(undefined1 (*) [16])
             ((pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.
              m_data.array + 0x15);
  dVar3 = (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
          array[0x17];
  auVar20._0_8_ = auVar29._0_8_ * dVar35;
  auVar20._8_8_ = auVar29._8_8_ * dVar35;
  auVar18 = vmulsd_avx512f(auVar43,auVar42);
  dVar35 = (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
           array[5];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar35;
  auVar19 = vfmadd231pd_fma(auVar20,auVar22,auVar45);
  auVar19 = vfmadd231pd_fma(auVar19,auVar23,auVar48);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar37 * dVar35;
  auVar18 = vaddsd_avx512f(auVar18,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [8];
  auVar19 = vfmadd231pd_fma(auVar19,auVar24,auVar50);
  auVar19 = vfmadd231pd_avx512vl(auVar19,auVar25,auVar8);
  auVar20 = vmulsd_avx512f(auVar48,auVar47);
  dVar35 = (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
           array[0xb];
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar35;
  auVar19 = vfmadd231pd_avx512vl(auVar19,auVar26,auVar9);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar2;
  auVar9 = vmulsd_avx512f(auVar9,auVar57);
  auVar19 = vfmadd231pd_fma(auVar19,auVar27,auVar41);
  auVar19 = vfmadd231pd_fma(auVar19,auVar28,auVar39);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar3;
  auVar21 = vmulsd_avx512f(auVar39,auVar55);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar1 * dVar35;
  auVar20 = vaddsd_avx512f(auVar20,auVar51);
  auVar18 = vaddsd_avx512f(auVar18,auVar20);
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.array
       [0xe];
  auVar8 = vmulsd_avx512f(auVar8,auVar52);
  auVar8 = vaddsd_avx512f(auVar8,auVar9);
  dVar35 = (pCVar5->super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>).m_storage.m_data.
           array[0x14];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar35;
  auVar9 = vmulsd_avx512f(auVar41,auVar53);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auVar9._0_8_ + auVar21._0_8_;
  auVar9 = vaddsd_avx512f(auVar8,auVar40);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (this->Ny).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[7];
  auVar8 = vmovddup_avx512vl(auVar8);
  auVar18 = vaddsd_avx512f(auVar18,auVar9);
  auVar9 = vmulpd_avx512vl(auVar29,auVar10);
  auVar10 = vmulsd_avx512f(auVar42,auVar10);
  auVar20 = vmulpd_avx512vl(auVar29,auVar17);
  auVar29 = vshufpd_avx(auVar19,auVar19,1);
  auVar21 = vfmadd231pd_avx512vl(auVar9,auVar22,auVar11);
  auVar9 = vmulsd_avx512f(auVar44,auVar11);
  auVar11 = vaddsd_avx512f(auVar9,auVar10);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[1];
  auVar9 = vmovddup_avx512vl(auVar9);
  auVar10 = vfmadd231pd_avx512vl(auVar21,auVar23,auVar12);
  auVar12 = vmulsd_avx512f(auVar47,auVar12);
  auVar21 = vfmadd231pd_avx512vl(auVar10,auVar24,auVar13);
  auVar10 = vmulsd_avx512f(auVar49,auVar13);
  auVar12 = vaddsd_avx512f(auVar10,auVar12);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar10 = vmovddup_avx512vl(auVar10);
  auVar22 = vfmadd231pd_avx512vl(auVar20,auVar9,auVar22);
  auVar13 = vfmadd231pd_avx512vl(auVar21,auVar25,auVar14);
  auVar14 = vmulsd_avx512f(auVar52,auVar14);
  auVar20 = vaddsd_avx512f(auVar12,auVar11);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar11 = vmovddup_avx512vl(auVar11);
  auVar13 = vfmadd231pd_avx512vl(auVar13,auVar26,auVar15);
  auVar12 = vmulsd_avx512f(auVar57,auVar15);
  auVar14 = vaddsd_avx512f(auVar12,auVar14);
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar12 = vmovddup_avx512vl(auVar12);
  auVar13 = vfmadd231pd_avx512vl(auVar13,auVar27,auVar16);
  auVar15 = vmulsd_avx512f(auVar53,auVar16);
  auVar22 = vfmadd231pd_avx512vl(auVar22,auVar11,auVar23);
  auVar23 = vfmadd231pd_avx512vl(auVar13,auVar28,auVar8);
  auVar8 = vmulsd_avx512f(auVar55,auVar8);
  auVar22 = vfmadd231pd_avx512vl(auVar22,auVar10,auVar24);
  auVar24 = vaddsd_avx512f(auVar8,auVar15);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar8 = vmovddup_avx512vl(auVar13);
  auVar13 = vshufpd_avx512vl(auVar23,auVar23,1);
  auVar24 = vaddsd_avx512f(auVar24,auVar14);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar14 = vmovddup_avx512vl(auVar14);
  auVar24 = vaddsd_avx512f(auVar24,auVar20);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (this->Nz).super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar15 = vmovddup_avx512vl(auVar15);
  auVar22 = vfmadd231pd_avx512vl(auVar22,auVar15,auVar25);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar3;
  auVar25 = vmulsd_avx512f(auVar56,auVar8);
  auVar22 = vfmadd231pd_avx512vl(auVar22,auVar12,auVar26);
  auVar26 = vmulsd_avx512f(auVar49,auVar10);
  auVar22 = vfmadd231pd_avx512vl(auVar22,auVar14,auVar27);
  auVar27 = vmulsd_avx512f(auVar44,auVar9);
  auVar28 = vfmadd231pd_avx512vl(auVar22,auVar8,auVar28);
  auVar17 = vmulsd_avx512f(auVar42,auVar17);
  auVar8 = vmulsd_avx512f(auVar47,auVar11);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar2;
  auVar9 = vmulsd_avx512f(auVar58,auVar12);
  auVar10 = vmulsd_avx512f(auVar52,auVar15);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar35;
  auVar11 = vmulsd_avx512f(auVar54,auVar14);
  auVar22 = vshufpd_avx(auVar28,auVar28,1);
  auVar12 = vmulsd_avx512f(auVar24,auVar22);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       auVar25._0_8_ + auVar11._0_8_ + auVar9._0_8_ + auVar10._0_8_ +
       auVar26._0_8_ + auVar8._0_8_ + auVar27._0_8_ + auVar17._0_8_;
  auVar25 = vfmsub231sd_avx512f(auVar12,auVar13,auVar16);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar18._0_8_ * auVar22._0_8_;
  auVar22 = vfmsub231sd_fma(auVar21,auVar29,auVar16);
  auVar22 = vmulsd_avx512f(auVar23,auVar22);
  auVar23 = vmulsd_avx512f(auVar18,auVar13);
  auVar29 = vfmsub231sd_avx512f(auVar23,auVar29,auVar24);
  local_12b0.m_lhs.m_functor.m_other =
       (pCVar4->m_InertFlexVec).m_data[2] * 0.5 *
       (pCVar4->m_InertFlexVec).m_data[1] * 0.5 *
       (pCVar4->m_InertFlexVec).m_data[0] * 0.5 *
       (auVar28._0_8_ * auVar29._0_8_ + (auVar19._0_8_ * auVar25._0_8_ - auVar22._0_8_));
  local_12b0.m_rhs.m_matrix = a_rhs;
  local_1288 = a_rhs;
  memset(&local_1280,0,0x1200);
  local_12b8 = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,0,24,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,24,1,3,24>>const>,Eigen::Matrix<double,3,24,1,3,24>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,24,24,0,24,24>>(&local_1280,&local_12b0,a_rhs,&local_12b8);
  auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar38 = vpbroadcastq_avx512f(ZEXT816(0xc0));
  auVar32 = vpbroadcastq_avx512f(ZEXT816(8));
  do {
    auVar33 = vpmullq_avx512dq(auVar31,auVar38);
    auVar34 = vpbroadcastq_avx512f();
    auVar31 = vpaddq_avx512f(auVar31,auVar32);
    auVar34 = vpaddq_avx512f(auVar34,auVar33);
    vscatterqpd_avx512f(ZEXT864(result) + auVar33,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7));
    vscatterqpd_avx512f(ZEXT864(8) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x18));
    vscatterqpd_avx512f(ZEXT864(0x10) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x30));
    vscatterqpd_avx512f(ZEXT864(0x18) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x48));
    vscatterqpd_avx512f(ZEXT864(0x20) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x60));
    vscatterqpd_avx512f(ZEXT864(0x28) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x78));
    vscatterqpd_avx512f(ZEXT864(0x30) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x90));
    vscatterqpd_avx512f(ZEXT864(0x38) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0xa8));
    vscatterqpd_avx512f(ZEXT864(0x40) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0xc0));
    vscatterqpd_avx512f(ZEXT864(0x48) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0xd8));
    vscatterqpd_avx512f(ZEXT864(0x50) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0xf0));
    vscatterqpd_avx512f(ZEXT864(0x58) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x108));
    vscatterqpd_avx512f(ZEXT864(0x60) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x120));
    vscatterqpd_avx512f(ZEXT864(0x68) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x138));
    vscatterqpd_avx512f(ZEXT864(0x70) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x150));
    vscatterqpd_avx512f(ZEXT864(0x78) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x168));
    vscatterqpd_avx512f(ZEXT864(0x80) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x180));
    vscatterqpd_avx512f(ZEXT864(0x88) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x198));
    vscatterqpd_avx512f(ZEXT864(0x90) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x1b0));
    vscatterqpd_avx512f(ZEXT864(0x98) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x1c8));
    vscatterqpd_avx512f(ZEXT864(0xa0) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x1e0));
    vscatterqpd_avx512f(ZEXT864(0xa8) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x1f8));
    vscatterqpd_avx512f(ZEXT864(0xb0) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + lVar7 + 0x210));
    uVar6 = lVar7 + 0x228;
    lVar7 = lVar7 + 8;
    vscatterqpd_avx512f(ZEXT864(0xb8) + auVar34,0xffff,
                        *(undefined1 (*) [64])
                         (local_1280.
                          super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_0,_24,_24>_>.m_storage
                          .m_data.array + uVar6));
  } while (lVar7 != 0x18);
  return;
}

Assistant:

void Brick_Mass::Evaluate(ChMatrixNM<double, 24, 24>& result, const double x, const double y, const double z) {
    element->ShapeFunctions(N, x, y, z);
    element->ShapeFunctionsDerivativeX(Nx, x, y, z);
    element->ShapeFunctionsDerivativeY(Ny, x, y, z);
    element->ShapeFunctionsDerivativeZ(Nz, x, y, z);

    // S=[N1*eye(3) N2*eye(3) N3*eye(3) N4*eye(3)...]
    for (int i = 0; i < 8; i++) {
        S(0, 3 * i + 0) = N(i);
        S(1, 3 * i + 1) = N(i);
        S(2, 3 * i + 2) = N(i);
    }

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = (*d0).transpose() * Nx.transpose();
    rd0.col(1) = (*d0).transpose() * Ny.transpose();
    rd0.col(2) = (*d0).transpose() * Nz.transpose();
    double detJ0 = rd0.determinant();

    // Perform  r = S'*S
    double factor = detJ0 * (element->GetLengthX() / 2) * (element->GetLengthY() / 2) * (element->GetLengthZ() / 2);
    result = factor * S.transpose() * S;
}